

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::do_prune(utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
           *this,time_point now)

{
  bool bVar1;
  reference puVar2;
  reference __rhs;
  reference pvVar3;
  size_t lru_idx;
  element *e;
  size_type local_20;
  size_t ttl_idx;
  utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  time_point now_local;
  
  if (*(long *)(this + 0x30) != 0) {
    ttl_idx = (size_t)this;
    this_local = (utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                  *)now.__d.__r;
    e = (element *)
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa0));
    puVar2 = std::_List_iterator<unsigned_long>::operator*((_List_iterator<unsigned_long> *)&e);
    local_20 = *puVar2;
    __rhs = std::
            vector<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
            ::operator[]((vector<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
                          *)(this + 0x38),local_20);
    bVar1 = std::chrono::operator>=
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&this_local,&__rhs->m_expire_time);
    if (bVar1) {
      do_erase(this,local_20);
    }
    else {
      pvVar3 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::back
                         ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x88));
      do_erase(this,*pvVar3);
    }
  }
  return;
}

Assistant:

auto do_prune(std::chrono::steady_clock::time_point now) -> void
    {
        if (m_used_size > 0)
        {
            size_t   ttl_idx = *m_ttl_list.begin();
            element& e       = m_elements[ttl_idx];

            if (now >= e.m_expire_time)
            {
                do_erase(ttl_idx);
            }
            else
            {
                size_t lru_idx = m_lru_list.back();
                do_erase(lru_idx);
            }
        }
    }